

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layer_unconditional_strided(response_layer *layer,integral_image *iimage)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  float *pfVar8;
  bool *pbVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  float *data_1;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  float *pfVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  int ii;
  int iVar31;
  int iVar32;
  ulong uVar33;
  int iVar34;
  float *data;
  int iVar35;
  float *pfVar36;
  float *pfVar37;
  ulong uVar38;
  int iVar39;
  float *data_4;
  long lVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  ulong uVar53;
  float *pfVar54;
  int iVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float *local_158;
  int local_108;
  
  iVar26 = layer->filter_size;
  pfVar8 = layer->response;
  iVar5 = layer->step;
  lVar57 = (long)iVar5;
  iVar6 = layer->height;
  iVar32 = iVar26 >> 0x1f;
  iVar21 = iVar26 / 3 + iVar32;
  uVar27 = iVar21 - iVar32;
  fVar59 = 1.0 / (float)(iVar26 * iVar26);
  uVar18 = (long)((iVar21 + 1) - iVar32) / (long)iVar5;
  uVar16 = uVar18 & 0xffffffff;
  uVar7 = layer->width;
  uVar53 = (ulong)uVar7;
  if (0 < (long)iVar6) {
    pbVar9 = layer->laplacian;
    iVar34 = 0;
    uVar14 = (iVar26 + -1) - (iVar26 + -1 >> 0x1f) >> 1;
    iVar20 = (iVar26 + -1) - uVar14;
    uVar14 = ~uVar14;
    iVar29 = uVar27 - 1;
    iVar35 = -uVar27;
    iVar31 = iVar29 - iVar26 / 6;
    uVar19 = ~(iVar26 / 6);
    iVar15 = 0;
    uVar28 = uVar14;
    iVar26 = iVar20;
    iVar21 = iVar29;
    uVar25 = uVar19;
    iVar32 = iVar31;
    do {
      if (0 < (int)uVar7) {
        iVar22 = iimage->data_width;
        pfVar54 = iimage->data;
        iVar55 = iVar22 * iVar21;
        iVar39 = iVar22 * iVar35;
        uVar30 = 0;
        pfVar36 = pfVar54 + -(long)(int)uVar27;
        iVar56 = 0;
        do {
          iVar41 = iVar39 + uVar14 + iVar56;
          iVar42 = iVar20 + iVar55 + iVar56;
          iVar43 = iVar55 + uVar14 + iVar56;
          iVar44 = iVar20 + iVar39 + iVar56;
          iVar45 = uVar19 + iVar39 + iVar56;
          iVar46 = iVar31 + iVar55 + iVar56;
          iVar47 = uVar19 + iVar55 + iVar56;
          iVar48 = iVar31 + iVar39 + iVar56;
          iVar49 = iVar22 * iVar26 + iVar29 + iVar56;
          iVar50 = iVar29 + iVar22 * uVar28 + iVar56;
          iVar51 = iVar22 * iVar32 + iVar29 + iVar56;
          iVar52 = iVar29 + iVar22 * uVar25 + iVar56;
          iVar56 = iVar5 + iVar56;
          auVar12 = vfmadd213ss_fma(ZEXT416((uint)((pfVar54[iVar45] - pfVar54[iVar47]) +
                                                  (pfVar54[iVar46] - pfVar54[iVar48]))),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)((pfVar54[iVar41] - pfVar54[iVar43]) +
                                                  (pfVar54[iVar42] - pfVar54[iVar44]))));
          auVar13 = vfmadd213ss_fma(ZEXT416((uint)((pfVar54[iVar51] - pfVar54[iVar52]) +
                                                  (pfVar36[(int)(iVar22 * uVar25)] -
                                                  pfVar36[iVar22 * iVar32]))),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)((pfVar36[(int)(iVar22 * uVar28)] -
                                                   pfVar36[iVar22 * iVar26]) +
                                                  (pfVar54[iVar49] - pfVar54[iVar50]))));
          fVar60 = fVar59 * auVar12._0_4_;
          fVar61 = fVar59 * auVar13._0_4_;
          pfVar8[(long)iVar15 + uVar30] = fVar60 * fVar61;
          pbVar9[uVar30 + (long)iVar15] = 0.0 <= fVar60 + fVar61;
          pfVar36 = pfVar36 + lVar57;
          uVar30 = uVar30 + 1;
        } while (uVar53 != uVar30);
        iVar15 = iVar15 + (int)uVar30;
      }
      iVar34 = iVar34 + 1;
      iVar21 = iVar21 + iVar5;
      iVar35 = iVar35 + iVar5;
      iVar32 = iVar32 + iVar5;
      uVar25 = uVar25 + iVar5;
      iVar26 = iVar26 + iVar5;
      uVar28 = uVar28 + iVar5;
    } while (iVar34 != iVar6);
  }
  local_108 = (int)uVar18;
  if (0 < local_108) {
    iVar26 = local_108 * iVar5;
    uVar28 = ~uVar27;
    iVar21 = iVar6 + local_108 * -0xc;
    lVar4 = (long)(int)uVar7 * 4;
    lVar17 = (long)(int)uVar7 * uVar16;
    uVar18 = 0;
    do {
      iVar32 = (int)uVar18;
      uVar30 = uVar18;
      if (iVar32 <= iVar21) {
        do {
          if (0 < (int)uVar7) {
            iVar15 = iVar5 * (int)uVar30;
            iVar32 = iimage->data_width;
            pfVar36 = iimage->data;
            pfVar54 = (float *)(lVar4 * uVar30 + (long)pfVar8);
            iVar31 = (iVar15 + uVar28) * iVar32;
            iVar20 = (iVar15 + -1) * iVar32;
            uVar38 = 0;
            iVar29 = 0;
            iVar15 = -1;
            lVar40 = 0;
            uVar25 = uVar27;
            uVar14 = uVar28;
            do {
              lVar23 = uVar38 * lVar57;
              iVar34 = (int)lVar23;
              fVar60 = (pfVar36[iVar31 + lVar23] - pfVar36[iVar20 + lVar23]) +
                       (pfVar36[(int)(iVar20 + uVar27 + iVar34)] -
                       pfVar36[(int)(uVar27 + iVar34 + iVar31)]);
              pfVar24 = (float *)(lVar57 * 4 * uVar30 * (long)iVar32 + (long)pfVar36);
              uVar33 = uVar30;
              pfVar37 = pfVar54;
              fVar61 = (pfVar36[(int)(iVar31 + uVar28 + iVar34)] -
                       pfVar36[(int)(uVar28 + iVar34 + iVar20)]) +
                       (pfVar36[iVar20 + -1 + iVar34] - pfVar36[iVar31 + -1 + iVar34]);
              iVar34 = (iVar5 * (int)uVar30 + uVar27) * iVar32;
              do {
                lVar58 = (long)iVar34;
                iVar35 = uVar25 + iVar34;
                pfVar1 = pfVar24 + (int)uVar25;
                uVar33 = uVar33 + uVar16;
                fVar10 = (pfVar24[(int)uVar14] - pfVar36[(int)(uVar14 + iVar34)]) +
                         (pfVar36[iVar29 + -1 + iVar34] - pfVar24[iVar15]);
                pfVar2 = (float *)((long)pfVar24 + lVar40);
                pfVar24 = (float *)((long)pfVar24 + (long)iVar32 * lVar57 * uVar16 * 4);
                iVar34 = iVar34 + iVar26 * iVar32;
                fVar11 = fVar60 + fVar10;
                fVar60 = (*pfVar2 - pfVar36[lVar23 + lVar58]) + (pfVar36[iVar35] - *pfVar1);
                fVar61 = fVar59 * ((fVar11 - fVar61) - fVar60);
                auVar12 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 * -0.81)),ZEXT416((uint)fVar61),
                                          ZEXT416((uint)*pfVar37));
                *pfVar37 = auVar12._0_4_;
                pfVar37 = pfVar37 + lVar17;
                fVar61 = fVar10;
              } while ((long)uVar33 < (long)((uint)(local_108 * 0xc) + uVar30));
              lVar40 = lVar40 + lVar57 * 4;
              uVar38 = uVar38 + 1;
              pfVar54 = pfVar54 + 1;
              uVar25 = uVar25 + iVar5;
              iVar29 = iVar29 + iVar5;
              uVar14 = uVar14 + iVar5;
              iVar15 = iVar15 + iVar5;
            } while (uVar38 != uVar53);
          }
          uVar30 = (uint)(local_108 * 0xc) + uVar30;
        } while ((long)uVar30 <= (long)iVar21);
        iVar32 = (int)uVar30;
      }
      if (iVar32 < iVar6) {
        lVar40 = (long)iVar32;
        iVar32 = iVar32 * iVar5;
        iVar20 = iVar32 + -1;
        local_158 = (float *)(lVar4 * lVar40 + (long)pfVar8);
        iVar15 = uVar27 + iVar32;
        iVar29 = uVar28 + iVar32;
        do {
          if (0 < (int)uVar7) {
            iVar39 = 0;
            pfVar36 = iimage->data;
            iVar31 = iimage->data_width;
            iVar22 = iVar31 * iVar20;
            iVar34 = iVar31 * iVar29;
            iVar35 = iVar31 * iVar15;
            iVar31 = iVar31 * iVar32;
            pfVar54 = pfVar36;
            pfVar24 = local_158;
            uVar30 = uVar53;
            do {
              iVar55 = iVar22 + uVar27 + iVar39;
              pfVar37 = pfVar54 + iVar34;
              iVar56 = uVar27 + iVar34 + iVar39;
              pfVar1 = pfVar54 + iVar22;
              iVar41 = uVar28 + iVar31 + iVar39;
              iVar42 = iVar35 + -1 + iVar39;
              iVar43 = uVar28 + iVar35 + iVar39;
              iVar44 = iVar31 + -1 + iVar39;
              iVar45 = uVar28 + iVar34 + iVar39;
              iVar46 = iVar22 + -1 + iVar39;
              iVar47 = uVar28 + iVar22 + iVar39;
              iVar48 = iVar34 + -1 + iVar39;
              iVar49 = iVar35 + uVar27 + iVar39;
              iVar50 = uVar27 + iVar31 + iVar39;
              pfVar2 = pfVar54 + iVar31;
              iVar39 = iVar39 + iVar5;
              pfVar3 = pfVar54 + iVar35;
              pfVar54 = pfVar54 + lVar57;
              fVar60 = fVar59 * ((((*pfVar37 - *pfVar1) + (pfVar36[iVar55] - pfVar36[iVar56]) +
                                  (pfVar36[iVar41] - pfVar36[iVar43]) +
                                  (pfVar36[iVar42] - pfVar36[iVar44])) -
                                 ((pfVar36[iVar45] - pfVar36[iVar47]) +
                                 (pfVar36[iVar46] - pfVar36[iVar48]))) -
                                ((*pfVar2 - *pfVar3) + (pfVar36[iVar49] - pfVar36[iVar50])));
              auVar12 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 * -0.81)),ZEXT416((uint)fVar60),
                                        ZEXT416((uint)*pfVar24));
              *pfVar24 = auVar12._0_4_;
              pfVar24 = pfVar24 + 1;
              uVar30 = uVar30 - 1;
            } while (uVar30 != 0);
          }
          local_158 = local_158 + lVar17;
          lVar40 = lVar40 + uVar16;
          iVar15 = iVar15 + iVar26;
          iVar20 = iVar20 + iVar26;
          iVar29 = iVar29 + iVar26;
          iVar32 = iVar32 + iVar26;
        } while (lVar40 < iVar6);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar16);
  }
  return;
}

Assistant:

void compute_response_layer_unconditional_strided(struct response_layer *layer, struct integral_image *iimage) {
    /*
    base function: compute_response_layer_unconditional

    optimizations:
        - Computes Dxy in a strided manner (reusing parts), as a result eliminates unnecessary
            recomputations
    */

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);

    int Dxy_stride = (lobe+1)/step;
    // printf("\nDxy_stride: lobe+1:%d step:%d Dxy_stride:%d\n", lobe+1, step, Dxy_stride);

    // int Dxx_col_stride = lobe/step;
    // printf("Dyy_row_stride/Dxx_col_stride: lobe:%d step:%d Dxx_col_stride:%d\n", lobe, step, Dxx_col_stride);

    int Dxx_col_stride = (2*lobe)/step;
    // printf("2*Dyy_row_stride/2*Dxx_col_stride: lobe:%d step:%d 2*Dxx_col_stride:%d\n", lobe, step, Dxx_col_stride);

    // int Dxx_row_stride = (2*lobe - 1)/step;
    // printf("Dyy_col_stride/Dxx_row_stride: 2*lobe-1:%d step:%d Dxx_row_stride:%d\n", 2*lobe-1, step, Dxx_row_stride);

    // int Dyy_col_stride = (2*lobe - 1)/step;
    int Dyy_row_stride = (2*lobe)/step;

    for (int i = 0, ind = 0; i < height; ++i) {
        int x = i*step;
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            int y = j*step;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy;
            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0);
        }
    }
    /*
    {
        int i_unroll = 24;
    // printf("\n");
    // printf("Dyy_row_stride %d step %d \n", Dyy_row_stride, step);
    // for (int i_offset=0; i_offset<Dyy_row_stride-i_unroll+1; i_offset+=i_unroll) {
        int i_offset=0;
        for (; i_offset<Dyy_row_stride; i_offset+=1) {
            // printf("j_offset: %d - %d ", j_offset, j_offset+j_unroll-1);
            int i = i_offset;
            for (; i < height-(Dyy_row_stride*i_unroll)+1; i+=Dyy_row_stride*i_unroll) {

                for (int j = 0; j < width; j++) {
                    int y = j*step;
                    int x = i*step;
                    for (int ii = i; ii<i+(Dyy_row_stride*i_unroll); ii+=Dyy_row_stride) {
                        // Image coordinates
                        int x = ii*step;

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                                - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dyy *= inv_area;

                        // Calculate Determinant
                        response[ii*width + j] = Dxx * Dyy;
                        // Calculate Laplacian
                        laplacian[ii*width + j] = (Dxx + Dyy >= 0);
                    }
                }
            }

            for (; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j++) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                            - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                    float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                            - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

                    // Normalize Responses with inverse area
                    Dxx *= inv_area;
                    Dyy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] = Dxx * Dyy;
                    // Calculate Laplacian
                    laplacian[i*width + j] = (Dxx + Dyy >= 0);

                }

            }
        }
    }
    */



    // strided Dxy
    {
        int i_unroll = 12;
    // printf("\n");
    // printf("Dxy_stride %d step %d \n", Dxy_stride, step);
    // for (int i_offset=0; i_offset<Dxy_stride-i_unroll+1; i_offset+=i_unroll) {
        int i_offset=0;
        /**/
        for (; i_offset<Dxy_stride; i_offset+=1) {
            // printf("j_offset: %d - %d ", j_offset, j_offset+j_unroll-1);
            int i = i_offset;
            for (; i < height-(Dxy_stride*i_unroll)+1; i+=Dxy_stride*i_unroll) {

                for (int j = 0; j < width; j++) {
                    int y = j*step;
                    int x = i*step;
                    float bottom_left = box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe);
                    float bottom_right = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe);
                    for (int ii = i; ii<i+(Dxy_stride*i_unroll); ii+=Dxy_stride) {
                        // Image coordinates
                        int x = ii*step;

                        float top_left = bottom_left;//box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe);
                        float top_right = bottom_right;//box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe);

                        bottom_left = box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe);
                        bottom_right = box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);


                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        float Dxy = top_right //box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + bottom_left //box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - top_left //box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - bottom_right; //box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                        // Normalize Responses with inverse area
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ii*width + j] -= 0.81f * Dxy * Dxy;
                        // printf("ii:%d ",ii);
                    }
                }
            }
            // printf("i:%d \n",i);

            for (; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j++) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                            + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                    // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                    // Normalize Responses with inverse area
                    Dxy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] -= 0.81f * Dxy * Dxy;

                }

            }
        }
    }
        /**/
        /*
        for (; i_offset<Dxy_stride; i_offset+=1) {
            // printf("j_offset: %d ", j_offset);
            for (int i = i_offset; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j+=1) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                            + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                    // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                    // Normalize Responses with inverse area
                    Dxy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] -= 0.81f * Dxy * Dxy;

                }

            }
        }
        */
    // }
}